

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiWindow *under_this_window;
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *popup_window;
  ImGuiWindow *focus_window;
  ImGuiContext *g;
  bool restore_focus_to_window_under_popup_local;
  int remaining_local;
  
  pIVar2 = GImGui;
  bVar1 = false;
  if (-1 < remaining) {
    bVar1 = remaining < (GImGui->OpenPopupStack).Size;
  }
  if (bVar1) {
    pIVar3 = ImVector<ImGuiPopupData>::operator[](&GImGui->OpenPopupStack,remaining);
    popup_window = pIVar3->SourceWindow;
    pIVar3 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,remaining);
    under_this_window = pIVar3->Window;
    ImVector<ImGuiPopupData>::resize(&pIVar2->OpenPopupStack,remaining);
    if (restore_focus_to_window_under_popup) {
      if (((popup_window == (ImGuiWindow *)0x0) || ((popup_window->WasActive & 1U) != 0)) ||
         (under_this_window == (ImGuiWindow *)0x0)) {
        if ((pIVar2->NavLayer == ImGuiNavLayer_Main) && (popup_window != (ImGuiWindow *)0x0)) {
          popup_window = NavRestoreLastChildNavWindow(popup_window);
        }
        FocusWindow(popup_window);
      }
      else {
        FocusTopMostWindowUnderOne(under_this_window,(ImGuiWindow *)0x0);
      }
    }
    return;
  }
  __assert_fail("remaining >= 0 && remaining < g.OpenPopupStack.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                ,0x1e17,"void ImGui::ClosePopupToLevel(int, bool)");
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}